

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-type.c
# Opt level: O1

coda_grib_value_array *
coda_grib_value_array_simple_packing_new
          (coda_type_array *definition,long num_elements,int64_t byte_offset,int element_bit_size,
          int16_t decimalScaleFactor,int16_t binaryScaleFactor,float referenceValue,uint8_t *bitmask
          )

{
  byte bVar1;
  coda_grib_value_array *type;
  long lVar2;
  uint8_t *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  size_t __size;
  double dVar7;
  double dVar8;
  
  type = coda_grib_value_array_new(definition,num_elements,byte_offset);
  if (type == (coda_grib_value_array *)0x0) {
    type = (coda_grib_value_array *)0x0;
  }
  else {
    type->simple_packing = 1;
    type->element_bit_size = element_bit_size;
    type->decimalScaleFactor = decimalScaleFactor;
    type->binaryScaleFactor = binaryScaleFactor;
    type->referenceValue = referenceValue;
    lVar2 = (long)binaryScaleFactor;
    if (binaryScaleFactor < 0) {
      dVar8 = 1.0;
      do {
        dVar8 = dVar8 + dVar8;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0);
      dVar8 = 1.0 / dVar8;
    }
    else {
      dVar8 = 1.0;
      if (binaryScaleFactor != 0) {
        do {
          dVar8 = dVar8 + dVar8;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
    }
    lVar2 = (long)decimalScaleFactor;
    if (decimalScaleFactor < 1) {
      dVar7 = 1.0;
      lVar5 = lVar2;
      if (decimalScaleFactor != 0) {
        do {
          dVar7 = dVar7 * 10.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0);
      }
    }
    else {
      dVar7 = 1.0;
      lVar5 = lVar2;
      do {
        dVar7 = dVar7 * 10.0;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      dVar7 = 1.0 / dVar7;
    }
    type->scalefactor = dVar8 * dVar7;
    if (decimalScaleFactor < 1) {
      dVar8 = 1.0;
      if (decimalScaleFactor != 0) {
        do {
          dVar8 = dVar8 * 10.0;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
      }
    }
    else {
      dVar8 = 1.0;
      do {
        dVar8 = dVar8 * 10.0;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      dVar8 = 1.0 / dVar8;
    }
    type->offset = dVar8 * (double)referenceValue;
    type->bitmask = (uint8_t *)0x0;
    type->bitmask_cumsum128 = (uint8_t *)0x0;
    if (bitmask != (uint8_t *)0x0) {
      __size = ((num_elements >> 3) + 1) - (ulong)((num_elements & 7U) == 0);
      puVar3 = (uint8_t *)malloc(__size);
      type->bitmask = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        uVar6 = 0xad;
      }
      else {
        memcpy(puVar3,bitmask,__size);
        puVar3 = (uint8_t *)malloc(__size);
        type->bitmask_cumsum128 = puVar3;
        if (puVar3 != (uint8_t *)0x0) {
          if ((long)__size < 1) {
            return type;
          }
          uVar4 = 0;
          do {
            bVar1 = type->bitmask[uVar4];
            type->bitmask_cumsum128[uVar4] =
                 ((bVar1 & 1) - ((char)bVar1 >> 7)) + (bVar1 >> 6 & 1) + ((bVar1 >> 5 & 1) != 0) +
                 (bVar1 >> 4 & 1) + ((bVar1 >> 3 & 1) != 0) + (bVar1 >> 2 & 1) +
                 ((bVar1 >> 1 & 1) != 0);
            if ((uVar4 & 0xf) != 0) {
              puVar3 = type->bitmask_cumsum128 + uVar4;
              *puVar3 = *puVar3 + type->bitmask_cumsum128[uVar4 - 1];
            }
            uVar4 = uVar4 + 1;
          } while (__size != uVar4);
          return type;
        }
        uVar6 = 0xb7;
      }
      coda_grib_type_delete((coda_dynamic_type *)type);
      type = (coda_grib_value_array *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-type.c"
                     ,(ulong)uVar6);
    }
  }
  return type;
}

Assistant:

coda_grib_value_array *coda_grib_value_array_simple_packing_new(coda_type_array *definition, long num_elements,
                                                                int64_t byte_offset, int element_bit_size,
                                                                int16_t decimalScaleFactor, int16_t binaryScaleFactor,
                                                                float referenceValue, const uint8_t *bitmask)
{
    coda_grib_value_array *type;
    long bitmask_size;
    long i;

    type = coda_grib_value_array_new(definition, num_elements, byte_offset);
    if (type == NULL)
    {
        return NULL;
    }

    type->simple_packing = 1;
    type->element_bit_size = element_bit_size;
    type->decimalScaleFactor = decimalScaleFactor;
    type->binaryScaleFactor = binaryScaleFactor;
    type->referenceValue = referenceValue;
    type->scalefactor = fpow(2, binaryScaleFactor) * fpow(10, -decimalScaleFactor);
    type->offset = referenceValue * fpow(10, -decimalScaleFactor);
    type->bitmask = NULL;
    type->bitmask_cumsum128 = NULL;

    if (bitmask != NULL)
    {
        bitmask_size = bit_size_to_byte_size(num_elements);
        type->bitmask = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        memcpy(type->bitmask, bitmask, bitmask_size);

        type->bitmask_cumsum128 = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask_cumsum128 == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        for (i = 0; i < bitmask_size; i++)
        {
            uint8_t bm = type->bitmask[i];

            type->bitmask_cumsum128[i] = ((bm >> 7) & 1) + ((bm >> 6) & 1) + ((bm >> 5) & 1) + ((bm >> 4) & 1) +
                ((bm >> 3) & 1) + ((bm >> 2) & 1) + ((bm >> 1) & 1) + (bm & 1);
            if (i % 16 != 0)
            {
                type->bitmask_cumsum128[i] += type->bitmask_cumsum128[i - 1];
            }
        }
    }

    return type;
}